

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::AtomicUsageTest<glcts::ArraysOfArrays::Interface::GL>::execute
          (AtomicUsageTest<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type,GLuint binding,GLuint offset,GLuint n_entries)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  int *piVar4;
  TestError *pTVar5;
  char *pcVar6;
  undefined1 *puVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  undefined1 *puVar11;
  string *psVar12;
  undefined1 *puVar13;
  ulong n_entries_00;
  undefined1 *puVar14;
  undefined1 *puVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  GLuint vao_id;
  GLuint texture_object_id;
  GLuint framebuffer_object_id;
  string valid_shader_source;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer_data;
  string indent;
  string result;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dimensions;
  string valid_definition;
  string indexing;
  string comment;
  string valid_iteration;
  string loop_end;
  GLuint buffer_object_id;
  string varying_definition;
  long lVar3;
  
  iVar1 = (*((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).context_id)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  comment._M_string_length = 0;
  comment.field_2._M_local_buf[0] = '\0';
  dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  indent._M_string_length = 0;
  indent.field_2._M_local_buf[0] = '\0';
  indexing._M_dataplus._M_p = (pointer)&indexing.field_2;
  indexing._M_string_length = 0;
  indexing.field_2._M_local_buf[0] = '\0';
  loop_end._M_dataplus._M_p = (pointer)&loop_end.field_2;
  loop_end._M_string_length = 0;
  loop_end.field_2._M_local_buf[0] = '\0';
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  valid_shader_source._M_dataplus._M_p = (pointer)&valid_shader_source.field_2;
  valid_shader_source._M_string_length = 0;
  valid_shader_source.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&valid_definition,execute::layout_binding,(allocator<char> *)&valid_iteration
            );
  valid_iteration._M_dataplus._M_p = (pointer)&valid_iteration.field_2;
  valid_iteration._M_string_length = 0;
  valid_iteration.field_2._M_local_buf[0] = '\0';
  varying_definition._M_dataplus._M_p = (pointer)&varying_definition.field_2;
  varying_definition._M_string_length = 0;
  varying_definition.field_2._M_local_buf[0] = '\0';
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&dimensions,8);
  n_entries_00 = (ulong)n_entries;
  prepareDimensions<glcts::ArraysOfArrays::Interface::GL>(n_entries_00,&dimensions);
  sprintf((char *)&buffer_data,"%u",(ulong)binding);
  std::__cxx11::string::append((char *)&valid_definition);
  std::__cxx11::string::append((char *)&valid_definition);
  sprintf((char *)&buffer_data,"%u",(ulong)offset);
  std::__cxx11::string::append((char *)&valid_definition);
  std::__cxx11::string::append((char *)&valid_definition);
  lVar16 = 7;
  uVar17 = 0;
  do {
    std::__cxx11::string::append((char *)&indent);
    std::__cxx11::string::replace((ulong)&loop_end,0,(char *)0x0,0x1c1cae3);
    std::__cxx11::string::replace((ulong)&loop_end,0,(char *)0x0,(ulong)indent._M_dataplus._M_p);
    sprintf((char *)&buffer_data,"i%u",uVar17);
    std::__cxx11::string::append((char *)&indexing);
    std::__cxx11::string::append((char *)&indexing);
    std::__cxx11::string::append((char *)&indexing);
    sprintf((char *)&buffer_object_id,"%u",
            (ulong)(uint)dimensions.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar16]);
    std::__cxx11::string::append((char *)&valid_definition);
    std::__cxx11::string::append((char *)&valid_definition);
    std::__cxx11::string::append((char *)&valid_definition);
    std::__cxx11::string::_M_append((char *)&valid_iteration,(ulong)indent._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::_M_append((char *)&valid_iteration,(ulong)indent._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&valid_iteration);
    uVar17 = (ulong)((int)uVar17 + 1);
    bVar18 = lVar16 != 0;
    lVar16 = lVar16 + -1;
  } while (bVar18);
  sprintf((char *)&buffer_data,"%u",(ulong)n_entries);
  std::__cxx11::string::append((char *)&comment);
  std::__cxx11::string::append((char *)&comment);
  std::__cxx11::string::append((char *)&comment);
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
    std::__cxx11::string::_M_replace((ulong)&result,0,(char *)result._M_string_length,0x1b19e3e);
    pcVar6 = "out vec4 color;\n\n";
    break;
  case VERTEX_SHADER_TYPE:
  case TESSELATION_EVALUATION_SHADER_TYPE:
    pcVar6 = "    fs_result = result;\n";
    goto LAB_00b73690;
  case COMPUTE_SHADER_TYPE:
    std::__cxx11::string::_M_replace((ulong)&result,0,(char *)result._M_string_length,0x1b19dea);
    pcVar6 = "writeonly uniform image2D uni_image;\n\n";
    break;
  case GEOMETRY_SHADER_TYPE:
    pcVar6 = 
    "    gl_Position  = vec4(-1, -1, 0, 1);\n    fs_result = result;\n    EmitVertex();\n    gl_Position  = vec4(-1, 1, 0, 1);\n    fs_result = result;\n    EmitVertex();\n    gl_Position  = vec4(1, -1, 0, 1);\n    fs_result = result;\n    EmitVertex();\n    gl_Position  = vec4(1, 1, 0, 1);\n    fs_result = result;\n    EmitVertex();\n"
    ;
LAB_00b73690:
    std::__cxx11::string::_M_replace((ulong)&result,0,(char *)result._M_string_length,(ulong)pcVar6)
    ;
    pcVar6 = "out float fs_result;\n\n";
    break;
  case TESSELATION_CONTROL_SHADER_TYPE:
    std::__cxx11::string::_M_replace((ulong)&result,0,(char *)result._M_string_length,0x1b19fac);
    pcVar6 = "out float tcs_result[];\n\n";
    break;
  default:
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x213b);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&varying_definition,0,(char *)varying_definition._M_string_length,(ulong)pcVar6)
  ;
  std::__cxx11::string::_M_append
            ((char *)&valid_shader_source,(ulong)varying_definition._M_dataplus._M_p);
  std::__cxx11::string::_M_append((char *)&valid_shader_source,(ulong)comment._M_dataplus._M_p);
  std::__cxx11::string::_M_append
            ((char *)&valid_shader_source,(ulong)valid_definition._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::_M_append
            ((char *)&valid_shader_source,(ulong)valid_iteration._M_dataplus._M_p);
  std::__cxx11::string::_M_append((char *)&valid_shader_source,(ulong)indent._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::_M_append((char *)&valid_shader_source,(ulong)indexing._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::_M_append((char *)&valid_shader_source,(ulong)loop_end._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::_M_append((char *)&valid_shader_source,(ulong)result._M_dataplus._M_p);
  psVar12 = &valid_shader_source;
  std::__cxx11::string::_M_append((char *)psVar12,shader_end_abi_cxx11_);
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
    puVar15 = (undefined1 *)&valid_shader_source;
    puVar13 = default_vertex_shader_source_abi_cxx11_;
    break;
  case VERTEX_SHADER_TYPE:
    puVar15 = pass_fragment_shader_source_abi_cxx11_;
    puVar13 = (undefined1 *)&valid_shader_source;
    break;
  case COMPUTE_SHADER_TYPE:
    puVar13 = empty_string_abi_cxx11_;
    puVar11 = empty_string_abi_cxx11_;
    puVar7 = empty_string_abi_cxx11_;
    puVar14 = empty_string_abi_cxx11_;
    puVar15 = empty_string_abi_cxx11_;
    goto LAB_00b7394d;
  case GEOMETRY_SHADER_TYPE:
    puVar15 = pass_fragment_shader_source_abi_cxx11_;
    puVar14 = (undefined1 *)&valid_shader_source;
    puVar13 = default_vertex_shader_source_abi_cxx11_;
    goto LAB_00b73924;
  case TESSELATION_CONTROL_SHADER_TYPE:
    puVar7 = pass_te_shader_source_abi_cxx11_;
    puVar11 = (undefined1 *)&valid_shader_source;
    goto LAB_00b73943;
  case TESSELATION_EVALUATION_SHADER_TYPE:
    puVar7 = (undefined1 *)&valid_shader_source;
    puVar11 = default_tc_shader_source_abi_cxx11_;
LAB_00b73943:
    puVar15 = pass_fragment_shader_source_abi_cxx11_;
    puVar14 = empty_string_abi_cxx11_;
    puVar13 = default_vertex_shader_source_abi_cxx11_;
    psVar12 = (string *)empty_string_abi_cxx11_;
    goto LAB_00b7394d;
  default:
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x217d);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  puVar14 = empty_string_abi_cxx11_;
LAB_00b73924:
  puVar7 = empty_string_abi_cxx11_;
  puVar11 = empty_string_abi_cxx11_;
  psVar12 = (string *)puVar11;
LAB_00b7394d:
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[10])(this,puVar13,puVar11,puVar7,puVar14,puVar15,psVar12,0,0);
  (**(code **)(lVar3 + 0x1680))
            ((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).program_object_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glUseProgram() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x218c);
  buffer_object_id = 0;
  buffer_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(lVar3 + 0x6c8))(1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenBuffers() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x2196);
  (**(code **)(lVar3 + 0x40))(0x92c0,buffer_object_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x2199);
  uVar17 = (ulong)(offset >> 2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&buffer_data,uVar17 + n_entries_00);
  lVar16 = (uVar17 + n_entries_00) * 4;
  if (n_entries != 0) {
    uVar8 = 0;
    do {
      *(int *)((long)buffer_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start +
              uVar8 * 4 + (ulong)((offset >> 2) * 4)) = (int)uVar8;
      uVar8 = uVar8 + 1;
    } while (n_entries_00 != uVar8);
  }
  (**(code **)(lVar3 + 0x150))
            (0x92c0,lVar16,
             buffer_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBufferData() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x21a2);
  (**(code **)(lVar3 + 0x48))(0x92c0,binding,buffer_object_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindBufferBase() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x21a5);
  if (tested_shader_type == COMPUTE_SHADER_TYPE) {
    (**(code **)(lVar3 + 0x528))(1,1,1);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glDrawArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21ef);
    (**(code **)(lVar3 + 0xdb8))(0xffffffff);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"MemoryBarrier.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21f2);
  }
  else {
    framebuffer_object_id = 0;
    texture_object_id = 0;
    vao_id = 0;
    (**(code **)(lVar3 + 0x6f8))(1);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glGenTextures() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21af);
    (**(code **)(lVar3 + 0xb8))(0xde1,texture_object_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glBindTexture() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21b2);
    (**(code **)(lVar3 + 0x1380))(0xde1,1,0x8058,1,1);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glTexStorage2D() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21b5);
    (**(code **)(lVar3 + 0x6d0))(1,&framebuffer_object_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glGenFramebuffers() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21b8);
    (**(code **)(lVar3 + 0x78))(0x8d40,framebuffer_object_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glBindFramebuffer() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21bb);
    (**(code **)(lVar3 + 0x6a0))(0x8d40,0x8ce0,0xde1,texture_object_id,0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glFramebufferTexture2D() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21be);
    (**(code **)(lVar3 + 0x1a00))(0,0,1,1);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glViewport() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21c1);
    (**(code **)(lVar3 + 0x708))(1,&vao_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glGenVertexArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21c4);
    (**(code **)(lVar3 + 0xd8))(vao_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glBindVertexArray() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21c7);
    if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
LAB_00b74206:
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x21dd);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if ((0xbU >> (tested_shader_type & 0x1f) & 1) == 0) {
      if ((0x30U >> (tested_shader_type & 0x1f) & 1) == 0) goto LAB_00b74206;
      (**(code **)(lVar3 + 0xfd8))(0x8e72,1);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"PatchParameteri",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                      ,0x21d6);
      (**(code **)(lVar3 + 0x538))(0xe,0,1);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      iVar1 = 0x21d9;
    }
    else {
      (**(code **)(lVar3 + 0x538))(0,0,1);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      iVar1 = 0x21cf;
    }
    glu::checkError(dVar2,"glDrawArrays() failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,iVar1);
    (**(code **)(lVar3 + 0xdb8))(0xffffffff);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"MemoryBarrier.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21e2);
    (**(code **)(lVar3 + 0xb8))(0xde1,0);
    (**(code **)(lVar3 + 0x78))(0x8d40,0);
    (**(code **)(lVar3 + 0xd8))(0);
    (**(code **)(lVar3 + 0x480))(1,&texture_object_id);
    (**(code **)(lVar3 + 0x440))(1,&framebuffer_object_id);
    (**(code **)(lVar3 + 0x490))(1,&vao_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"An error ocurred while deleting generated objects.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x21ea);
  }
  piVar4 = (int *)(**(code **)(lVar3 + 0xd00))(0x92c0,0,lVar16,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"MapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x21fa);
  bVar18 = 3 < offset;
  if ((bVar18) && (*piVar4 == 0)) {
    uVar8 = 1;
    do {
      uVar9 = uVar8;
      if (uVar17 == uVar9) break;
      uVar8 = uVar9 + 1;
    } while (piVar4[uVar9] == 0);
    bVar18 = uVar9 < uVar17;
  }
  if (n_entries != 0) {
    iVar10 = 0;
    iVar1 = 0;
    uVar8 = 1;
    do {
      if (tested_shader_type == TESSELATION_EVALUATION_SHADER_TYPE) {
        if (uVar8 == 1) {
          iVar1 = piVar4[uVar17];
          if (iVar1 < 1) {
LAB_00b73f5b:
            bVar18 = true;
            break;
          }
        }
        else if (piVar4[uVar17 + (uVar8 - 1)] + iVar10 != iVar1) goto LAB_00b73f5b;
      }
      else if (uVar8 != (uint)piVar4[uVar17 + (uVar8 - 1)]) goto LAB_00b73f5b;
      iVar10 = iVar10 + -1;
      bVar19 = uVar8 != n_entries_00;
      uVar8 = uVar8 + 1;
    } while (bVar19);
  }
  (**(code **)(lVar3 + 0x1670))(0x92c0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"UnmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x2229);
  (**(code **)(lVar3 + 0x438))(1,&buffer_object_id);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[5])(this);
  if (!bVar18) {
    if (buffer_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(buffer_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)buffer_data.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)buffer_data.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)varying_definition._M_dataplus._M_p != &varying_definition.field_2) {
      operator_delete(varying_definition._M_dataplus._M_p,
                      CONCAT71(varying_definition.field_2._M_allocated_capacity._1_7_,
                               varying_definition.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)valid_iteration._M_dataplus._M_p != &valid_iteration.field_2) {
      operator_delete(valid_iteration._M_dataplus._M_p,
                      CONCAT71(valid_iteration.field_2._M_allocated_capacity._1_7_,
                               valid_iteration.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)valid_definition._M_dataplus._M_p != &valid_definition.field_2) {
      operator_delete(valid_definition._M_dataplus._M_p,
                      valid_definition.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)valid_shader_source._M_dataplus._M_p != &valid_shader_source.field_2) {
      operator_delete(valid_shader_source._M_dataplus._M_p,
                      CONCAT71(valid_shader_source.field_2._M_allocated_capacity._1_7_,
                               valid_shader_source.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p != &result.field_2) {
      operator_delete(result._M_dataplus._M_p,
                      CONCAT71(result.field_2._M_allocated_capacity._1_7_,
                               result.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)loop_end._M_dataplus._M_p != &loop_end.field_2) {
      operator_delete(loop_end._M_dataplus._M_p,
                      CONCAT71(loop_end.field_2._M_allocated_capacity._1_7_,
                               loop_end.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)indexing._M_dataplus._M_p != &indexing.field_2) {
      operator_delete(indexing._M_dataplus._M_p,
                      CONCAT71(indexing.field_2._M_allocated_capacity._1_7_,
                               indexing.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)indent._M_dataplus._M_p != &indent.field_2) {
      operator_delete(indent._M_dataplus._M_p,
                      CONCAT71(indent.field_2._M_allocated_capacity._1_7_,
                               indent.field_2._M_local_buf[0]) + 1);
    }
    if (dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)dimensions.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)dimensions.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment._M_dataplus._M_p != &comment.field_2) {
      operator_delete(comment._M_dataplus._M_p,
                      CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                               comment.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"Invalid results.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x2231);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void AtomicUsageTest<API>::execute(typename TestCaseBase<API>::TestShaderType tested_shader_type, glw::GLuint binding,
								   glw::GLuint offset, glw::GLuint n_entries)
{
	static const char* indent_step		   = "    ";
	static const char* layout_binding	  = "layout(binding = ";
	static const char* layout_offset	   = ", offset = ";
	static const char* uniform_atomic_uint = ") uniform atomic_uint";

	const glw::Functions& gl = this->context_id.getRenderContext().getFunctions();

	std::string			comment;
	std::vector<size_t> dimensions;
	std::string			indent;
	std::string			indexing;
	std::string			loop_end;
	std::string			result;
	std::string			valid_shader_source;
	std::string			valid_definition = layout_binding;
	std::string			valid_iteration;
	std::string			varying_definition;

	dimensions.resize(API::MAX_ARRAY_DIMENSIONS);
	prepareDimensions<API>(n_entries, dimensions);

	/* Prepare parts of shader */

	/* Append binding */
	{
		char buffer[16];
		sprintf(buffer, "%u", static_cast<unsigned int>(binding));
		valid_definition += buffer;
		valid_definition += layout_offset;
		sprintf(buffer, "%u", static_cast<unsigned int>(offset));
		valid_definition += buffer;
		valid_definition += uniform_atomic_uint;
	}

	for (size_t i = API::MAX_ARRAY_DIMENSIONS; i != 0; --i)
	{
		char it[16];
		char max[16];

		indent += indent_step;

		loop_end.insert(0, "}\n");
		loop_end.insert(0, indent);

		sprintf(it, "i%u", (unsigned int)(API::MAX_ARRAY_DIMENSIONS - i));

		indexing += "[";
		indexing += it;
		indexing += "]";

		sprintf(max, "%u", (unsigned int)(dimensions[i - 1]));
		valid_definition += "[";
		valid_definition += max;
		valid_definition += "]";

		valid_iteration += indent;
		valid_iteration += "for (uint ";
		valid_iteration += it;
		valid_iteration += " = 0; ";
		valid_iteration += it;
		valid_iteration += " < ";
		valid_iteration += max;
		valid_iteration += "; ++";
		valid_iteration += it;
		valid_iteration += ")\n";
		valid_iteration += indent;
		valid_iteration += "{\n";
	}

	{
		char max[16];

		sprintf(max, "%u", (unsigned int)(n_entries));
		comment += "/* Number of atomic counters = ";
		comment += max;
		comment += " */\n";
	}

	/* Select varyings and result */
	switch (tested_shader_type)
	{
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
		result			   = "    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), vec4(result, 0, 0, 0));\n";
		varying_definition = "writeonly uniform image2D uni_image;\n"
							 "\n";
		break;

	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
		result			   = "    color = vec4(result);\n";
		varying_definition = "out vec4 color;\n"
							 "\n";
		break;

	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		result = "    gl_Position  = vec4(-1, -1, 0, 1);\n"
				 "    fs_result = result;\n"
				 "    EmitVertex();\n"
				 "    gl_Position  = vec4(-1, 1, 0, 1);\n"
				 "    fs_result = result;\n"
				 "    EmitVertex();\n"
				 "    gl_Position  = vec4(1, -1, 0, 1);\n"
				 "    fs_result = result;\n"
				 "    EmitVertex();\n"
				 "    gl_Position  = vec4(1, 1, 0, 1);\n"
				 "    fs_result = result;\n"
				 "    EmitVertex();\n";
		varying_definition = "out float fs_result;\n"
							 "\n";
		break;

	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
		result = "    tcs_result[gl_InvocationID] = result;\n"
				 "\n"
				 "    gl_TessLevelOuter[0] = 1.0;\n"
				 "    gl_TessLevelOuter[1] = 1.0;\n"
				 "    gl_TessLevelOuter[2] = 1.0;\n"
				 "    gl_TessLevelOuter[3] = 1.0;\n"
				 "    gl_TessLevelInner[0] = 1.0;\n"
				 "    gl_TessLevelInner[1] = 1.0;\n";
		varying_definition = "out float tcs_result[];\n"
							 "\n";
		break;

	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		result			   = "    fs_result = result;\n";
		varying_definition = "out float fs_result;\n"
							 "\n";
		break;

	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		result			   = "    fs_result = result;\n";
		varying_definition = "out float fs_result;\n"
							 "\n";
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	};

	/* Prepare valid source */
	valid_shader_source += varying_definition;
	valid_shader_source += comment;
	valid_shader_source += valid_definition;
	valid_shader_source += " a;\n\nvoid main()\n{\n    uint sum = 0u;\n";
	valid_shader_source += valid_iteration;
	valid_shader_source += indent;
	valid_shader_source += indent_step;
	valid_shader_source += "sum += atomicCounterIncrement( a";
	valid_shader_source += indexing;
	valid_shader_source += " );\n";
	valid_shader_source += loop_end;
	valid_shader_source += "\n"
						   "    float result = 0.0;\n"
						   "\n"
						   "    if (16u < sum)\n"
						   "    {\n"
						   "         result = 1.0;\n"
						   "    }\n";
	valid_shader_source += result;
	valid_shader_source += shader_end;

	/* Build program */
	{
		const std::string* cs  = &empty_string;
		const std::string* vs  = &default_vertex_shader_source;
		const std::string* tcs = &empty_string;
		const std::string* tes = &empty_string;
		const std::string* gs  = &empty_string;
		const std::string* fs  = &pass_fragment_shader_source;

		switch (tested_shader_type)
		{
		case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
			cs = &valid_shader_source;
			vs = &empty_string;
			fs = &empty_string;
			break;

		case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
			fs = &valid_shader_source;
			break;

		case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
			gs = &valid_shader_source;
			break;

		case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
			tcs = &valid_shader_source;
			tes = &pass_te_shader_source;
			break;

		case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
			tcs = &default_tc_shader_source;
			tes = &valid_shader_source;
			break;

		case TestCaseBase<API>::VERTEX_SHADER_TYPE:
			vs = &valid_shader_source;
			break;

		default:
			TCU_FAIL("Invalid enum");
			break;
		};

		if (API::USE_ALL_SHADER_STAGES)
		{
			this->execute_positive_test(*vs, *tcs, *tes, *gs, *fs, *cs, false, false);
		}
		else
		{
			this->execute_positive_test(*vs, *fs, false, false);
		}
	}

	gl.useProgram(this->program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed.");

	/* Prepare buffer */
	glw::GLuint				 buffer_object_id = 0;
	std::vector<glw::GLuint> buffer_data;
	const size_t			 start_pos		  = offset / 4;
	const size_t			 last_pos		  = start_pos + n_entries;
	const size_t			 buffer_data_size = last_pos * sizeof(glw::GLuint);

	gl.genBuffers(1, &buffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed.");

	gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed.");

	buffer_data.resize(start_pos + n_entries);
	for (size_t i = 0; i < n_entries; ++i)
	{
		buffer_data[start_pos + i] = (glw::GLuint)i;
	}

	gl.bufferData(GL_ATOMIC_COUNTER_BUFFER, buffer_data_size, &buffer_data[0], GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed.");

	gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, binding, buffer_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed.");

	/* Run program */
	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
	{
		glw::GLuint framebuffer_object_id = 0;
		glw::GLuint texture_object_id	 = 0;
		glw::GLuint vao_id				  = 0;

		gl.genTextures(1, &texture_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed.");

		gl.bindTexture(GL_TEXTURE_2D, texture_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() failed.");

		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() failed.");

		gl.genFramebuffers(1, &framebuffer_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() failed.");

		gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() failed.");

		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture_object_id, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() failed.");

		gl.viewport(0, 0, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() failed.");

		gl.genVertexArrays(1, &vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() failed.");

		gl.bindVertexArray(vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() failed.");

		switch (tested_shader_type)
		{
		case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
		case TestCaseBase<API>::VERTEX_SHADER_TYPE: /* Fall through */
		case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
			gl.drawArrays(GL_POINTS, 0, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
			break;

		case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: /* Fall through */
		case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
			/* Tesselation patch set up */
			gl.patchParameteri(GL_PATCH_VERTICES, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "PatchParameteri");

			gl.drawArrays(GL_PATCHES, 0, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");
			break;

		default:
			TCU_FAIL("Invalid enum");
			break;
		}

		gl.memoryBarrier(GL_ALL_BARRIER_BITS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier.");

		gl.bindTexture(GL_TEXTURE_2D, 0);
		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		gl.bindVertexArray(0);
		gl.deleteTextures(1, &texture_object_id);
		gl.deleteFramebuffers(1, &framebuffer_object_id);
		gl.deleteVertexArrays(1, &vao_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "An error ocurred while deleting generated objects.");
	}
	else
	{
		gl.dispatchCompute(1, 1, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed.");

		gl.memoryBarrier(GL_ALL_BARRIER_BITS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier.");
	}

	/* Verify results */
	bool test_result = true;

	const glw::GLuint* results =
		(glw::GLuint*)gl.mapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0 /* offset */, buffer_data_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "MapBufferRange");

	/* Anything before start position should be 0 */
	for (size_t i = 0; i < start_pos; ++i)
	{
		if (0 != results[i])
		{
			test_result = false;
			break;
		}
	}

	/* Anything from start_pos should be incremented by 1 */
	int diff = 0;
	for (size_t i = 0; i < n_entries; ++i)
	{
		/* Tesselation evaluation can be called several times
		 In here, check the increment is consistent over all results.
		 */
		if (tested_shader_type == TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE)
		{
			if (i == 0)
			{
				diff = static_cast<int>(results[i + start_pos]) - static_cast<int>(i);
				if (diff <= 0)
				{
					test_result = false;
					break;
				}
			}
			else if ((static_cast<int>(results[i + start_pos]) - static_cast<int>(i)) != diff)
			{
				test_result = false;
				break;
			}
		}
		else
		{
			if (i + 1 != results[i + start_pos])
			{
				test_result = false;
				break;
			}
		}
	}

	gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

	/* Deallocate any resources used. */
	gl.deleteBuffers(1, &buffer_object_id);
	this->delete_objects();

	if (false == test_result)
	{
		TCU_FAIL("Invalid results.");
	}
}